

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O2

int __thiscall libchess::Position::see_for(Position *this,Move move,array<int,_6UL> piece_values)

{
  array<int,_6UL> piece_values_00;
  Type TVar1;
  uint uVar2;
  int iVar3;
  optional<libchess::Piece> oVar4;
  array<int,_6UL> *paVar5;
  reference pvVar6;
  Square square;
  int iVar7;
  int iVar8;
  Position pos;
  Position local_b8;
  
  TVar1 = move_type_of(this,move);
  square.super_MetaValueType<int>.value_ = (MetaValueType<int>)((uint)move.value_ >> 6 & 0x3f);
  oVar4 = piece_on(this,square);
  iVar8 = 0;
  if (TVar1 == ENPASSANT ||
      ((ulong)oVar4.super__Optional_base<libchess::Piece,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::Piece> >> 0x20 & 1) != 0) {
    paVar5 = &piece_values;
    if (TVar1 != ENPASSANT) {
      paVar5 = (array<int,_6UL> *)
               std::array<int,_6UL>::at
                         (&piece_values,
                          (ulong)((uint)oVar4.super__Optional_base<libchess::Piece,_true,_true>.
                                        _M_payload.super__Optional_payload_base<libchess::Piece>.
                                        _M_payload & 7));
    }
    iVar7 = paVar5->_M_elems[0];
    uVar2 = (uint)move.value_ >> 0xc & 7;
    if ((uVar2 != 0) && (uVar2 != 5)) {
      pvVar6 = std::array<int,_6UL>::at(&piece_values,(ulong)uVar2);
      iVar7 = (iVar7 + *pvVar6) - piece_values._M_elems[0];
    }
    Position(&local_b8,this);
    make_move(&local_b8,move);
    piece_values_00._M_elems[1] = piece_values._M_elems[1];
    piece_values_00._M_elems[0] = piece_values._M_elems[0];
    piece_values_00._M_elems[2] = piece_values._M_elems[2];
    piece_values_00._M_elems[3] = piece_values._M_elems[3];
    piece_values_00._M_elems[4] = piece_values._M_elems[4];
    piece_values_00._M_elems[5] = piece_values._M_elems[5];
    iVar3 = see_to(&local_b8,square,piece_values_00);
    iVar8 = 0;
    if (0 < iVar7 - iVar3) {
      iVar8 = iVar7 - iVar3;
    }
    ~Position(&local_b8);
  }
  return iVar8;
}

Assistant:

inline int Position::see_for(Move move, std::array<int, 6> piece_values) {
    bool is_enpassant = move_type_of(move) == Move::Type::ENPASSANT;

    auto square_pt = piece_on(move.to_square());
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto move_prom_piece_type = move.promotion_piece_type();
    if (move_prom_piece_type) {
        piece_val += piece_values.at(move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(move);
    return std::max(0, piece_val - pos.see_to(move.to_square(), piece_values));
}